

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O3

void write_colormap(j_decompress_ptr cinfo,bmp_dest_ptr dest,int map_colors,int map_entry_size)

{
  JSAMPARRAY ppJVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  ppJVar1 = cinfo->colormap;
  if (ppJVar1 == (JSAMPARRAY)0x0) {
    iVar3 = 0;
    do {
      putc(iVar3,(FILE *)dest);
      putc(iVar3,(FILE *)dest);
      putc(iVar3,(FILE *)dest);
      if (map_entry_size == 4) {
        putc(0,(FILE *)dest);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x100);
    uVar4 = 0x100;
  }
  else {
    uVar4 = cinfo->actual_number_of_colors;
    if (cinfo->out_color_components == 3) {
      if (0 < (int)uVar4) {
        uVar5 = 0;
        do {
          putc((uint)ppJVar1[2][uVar5],(FILE *)dest);
          putc((uint)ppJVar1[1][uVar5],(FILE *)dest);
          putc((uint)(*ppJVar1)[uVar5],(FILE *)dest);
          if (map_entry_size == 4) {
            putc(0,(FILE *)dest);
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
        goto LAB_00105f8c;
      }
    }
    else if (0 < (int)uVar4) {
      uVar5 = 0;
      do {
        putc((uint)(*ppJVar1)[uVar5],(FILE *)dest);
        putc((uint)(*ppJVar1)[uVar5],(FILE *)dest);
        putc((uint)(*ppJVar1)[uVar5],(FILE *)dest);
        if (map_entry_size == 4) {
          putc(0,(FILE *)dest);
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
      goto LAB_00105f8c;
    }
    uVar4 = 0;
  }
LAB_00105f8c:
  if (map_colors < (int)uVar4) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x413;
    (pjVar2->msg_parm).i[0] = uVar4;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar3 = map_colors - uVar4;
  if (iVar3 != 0 && (int)uVar4 <= map_colors) {
    do {
      putc(0,(FILE *)dest);
      putc(0,(FILE *)dest);
      putc(0,(FILE *)dest);
      if (map_entry_size == 4) {
        putc(0,(FILE *)dest);
      }
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

LOCAL(void)
write_colormap(j_decompress_ptr cinfo, bmp_dest_ptr dest, int map_colors,
               int map_entry_size)
{
  JSAMPARRAY colormap = cinfo->colormap;
  int num_colors = cinfo->actual_number_of_colors;
  FILE *outfile = dest->pub.output_file;
  int i;

  if (colormap != NULL) {
    if (cinfo->out_color_components == 3) {
      /* Normal case with RGB colormap */
      for (i = 0; i < num_colors; i++) {
        putc(colormap[2][i], outfile);
        putc(colormap[1][i], outfile);
        putc(colormap[0][i], outfile);
        if (map_entry_size == 4)
          putc(0, outfile);
      }
    } else {
      /* Grayscale colormap (only happens with grayscale quantization) */
      for (i = 0; i < num_colors; i++) {
        putc(colormap[0][i], outfile);
        putc(colormap[0][i], outfile);
        putc(colormap[0][i], outfile);
        if (map_entry_size == 4)
          putc(0, outfile);
      }
    }
  } else {
    /* If no colormap, must be grayscale data.  Generate a linear "map". */
    for (i = 0; i < 256; i++) {
      putc(i, outfile);
      putc(i, outfile);
      putc(i, outfile);
      if (map_entry_size == 4)
        putc(0, outfile);
    }
  }
  /* Pad colormap with zeros to ensure specified number of colormap entries */
  if (i > map_colors)
    ERREXIT1(cinfo, JERR_TOO_MANY_COLORS, i);
  for (; i < map_colors; i++) {
    putc(0, outfile);
    putc(0, outfile);
    putc(0, outfile);
    if (map_entry_size == 4)
      putc(0, outfile);
  }
}